

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O2

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  byte *pbVar2;
  long lVar3;
  void *pvVar4;
  undefined1 (*addr) [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  void *pvVar10;
  ulong *puVar11;
  msegmentptr pmVar12;
  ulong uVar13;
  size_t dvs;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  undefined8 *puVar19;
  long *plVar20;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  undefined8 *puVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  if (nsize < 0xf1) {
    uVar13 = 0x20;
    if (0x16 < nsize) {
      uVar13 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar17 = *msp;
    bVar23 = (byte)(uVar13 >> 3);
    uVar21 = uVar17 >> (bVar23 & 0x1f);
    if ((uVar21 & 3) != 0) {
      uVar21 = (~uVar21 & 1) + (int)(uVar13 >> 3);
      lVar8 = (long)msp + (ulong)(uVar21 * 0x10) + 0x38;
      lVar28 = *(long *)((long)msp + (ulong)(uVar21 * 0x10) + 0x48);
      lVar16 = *(long *)(lVar28 + 0x10);
      if (lVar8 == lVar16) {
        *(uint *)msp = uVar17 & ~(1 << (uVar21 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar21 * 0x10) + 0x48) = lVar16;
        *(long *)(lVar16 + 0x18) = lVar8;
      }
      *(ulong *)(lVar28 + 8) = (ulong)(uVar21 * 8) + 3;
      pbVar2 = (byte *)(lVar28 + 8 + (ulong)(uVar21 * 8));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar28 + 0x10);
    }
    uVar14 = *(ulong *)((long)msp + 8);
    if (uVar14 < uVar13) {
      if (uVar17 >> (bVar23 & 0x1f) != 0) {
        uVar24 = 2 << (bVar23 & 0x1f);
        uVar24 = (-uVar24 | uVar24) & uVar21 << (bVar23 & 0x1f);
        uVar21 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        uVar24 = uVar21 << 4;
        lVar8 = (long)msp + (ulong)uVar24 + 0x38;
        lVar28 = *(long *)((long)msp + (ulong)uVar24 + 0x48);
        lVar16 = *(long *)(lVar28 + 0x10);
        if (lVar8 == lVar16) {
          uVar17 = uVar17 & ~(1 << (uVar21 & 0x1f));
          *(uint *)msp = uVar17;
        }
        else {
          *(long *)((long)msp + (ulong)uVar24 + 0x48) = lVar16;
          *(long *)(lVar16 + 0x18) = lVar8;
        }
        uVar25 = (ulong)(uVar21 * 8);
        uVar22 = uVar25 - uVar13;
        if (0x1f < uVar22) {
          *(ulong *)(lVar28 + 8) = uVar13 | 3;
          *(ulong *)(lVar28 + 8 + uVar13) = uVar22 | 1;
          *(ulong *)(lVar28 + uVar25) = uVar22;
          if (uVar14 != 0) {
            lVar16 = *(long *)((long)msp + 0x18);
            uVar14 = uVar14 >> 3;
            lVar8 = (long)msp + uVar14 * 0x10 + 0x38;
            if ((uVar17 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
              *(uint *)msp = uVar17 | 1 << ((byte)uVar14 & 0x1f);
              lVar27 = lVar8;
            }
            else {
              lVar27 = *(long *)(lVar8 + 0x10);
            }
            *(long *)(lVar8 + 0x10) = lVar16;
            *(long *)(lVar27 + 0x18) = lVar16;
            *(long *)(lVar16 + 0x10) = lVar27;
            *(long *)(lVar16 + 0x18) = lVar8;
          }
          *(ulong *)((long)msp + 8) = uVar22;
          *(ulong *)((long)msp + 0x18) = lVar28 + uVar13;
          return (void *)(lVar28 + 0x10);
        }
        *(ulong *)(lVar28 + 8) = uVar25 | 3;
        pbVar2 = (byte *)(lVar28 + 8 + uVar25);
        *pbVar2 = *pbVar2 | 1;
        return (void *)(lVar28 + 0x10);
      }
      uVar21 = *(uint *)((long)msp + 4);
      if (uVar21 != 0) {
        uVar24 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        lVar16 = *(long *)((long)msp + (ulong)uVar24 * 8 + 0x248);
        uVar22 = (*(ulong *)(lVar16 + 8) & 0xfffffffffffffffc) - uVar13;
        lVar28 = lVar16;
        while ((lVar8 = *(long *)(lVar28 + 0x20), lVar8 != 0 ||
               (lVar8 = *(long *)(lVar28 + 0x28), lVar8 != 0))) {
          uVar25 = (*(ulong *)(lVar8 + 8) & 0xfffffffffffffffc) - uVar13;
          lVar28 = lVar8;
          if (uVar25 < uVar22) {
            lVar16 = lVar8;
            uVar22 = uVar25;
          }
        }
        lVar28 = *(long *)(lVar16 + 0x18);
        lVar8 = *(long *)(lVar16 + 0x30);
        if (lVar28 == lVar16) {
          if (*(long *)(lVar16 + 0x28) == 0) {
            if (*(long *)(lVar16 + 0x20) == 0) {
              lVar28 = 0;
              goto LAB_00128857;
            }
            lVar27 = *(long *)(lVar16 + 0x20);
            puVar19 = (undefined8 *)(lVar16 + 0x20);
          }
          else {
            lVar27 = *(long *)(lVar16 + 0x28);
            puVar19 = (undefined8 *)(lVar16 + 0x28);
          }
          do {
            do {
              puVar26 = puVar19;
              lVar28 = lVar27;
              lVar27 = *(long *)(lVar28 + 0x28);
              puVar19 = (undefined8 *)(lVar28 + 0x28);
            } while (*(long *)(lVar28 + 0x28) != 0);
            lVar27 = *(long *)(lVar28 + 0x20);
            puVar19 = (undefined8 *)(lVar28 + 0x20);
          } while (*(long *)(lVar28 + 0x20) != 0);
          *puVar26 = 0;
        }
        else {
          lVar27 = *(long *)(lVar16 + 0x10);
          *(long *)(lVar27 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar27;
        }
LAB_00128857:
        if (lVar8 != 0) {
          lVar27 = *(long *)(lVar16 + 0x38);
          if (lVar16 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
            *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar28;
            if (lVar28 != 0) goto LAB_0012888c;
            *(uint *)((long)msp + 4) = uVar21 & ~(1 << ((uint)lVar27 & 0x1f));
          }
          else {
            *(long *)(lVar8 + 0x20 + (ulong)(*(long *)(lVar8 + 0x20) != lVar16) * 8) = lVar28;
            if (lVar28 != 0) {
LAB_0012888c:
              *(long *)(lVar28 + 0x30) = lVar8;
              lVar8 = *(long *)(lVar16 + 0x20);
              if (lVar8 != 0) {
                *(long *)(lVar28 + 0x20) = lVar8;
                *(long *)(lVar8 + 0x30) = lVar28;
              }
              lVar8 = *(long *)(lVar16 + 0x28);
              if (lVar8 != 0) {
                *(long *)(lVar28 + 0x28) = lVar8;
                *(long *)(lVar8 + 0x30) = lVar28;
              }
            }
          }
        }
        if (uVar22 < 0x20) {
          *(ulong *)(lVar16 + 8) = uVar22 + uVar13 | 3;
          pbVar2 = (byte *)(lVar16 + 8 + uVar22 + uVar13);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          *(ulong *)(lVar16 + 8) = uVar13 | 3;
          *(ulong *)(lVar16 + 8 + uVar13) = uVar22 | 1;
          *(ulong *)(lVar16 + uVar13 + uVar22) = uVar22;
          if (uVar14 != 0) {
            lVar28 = *(long *)((long)msp + 0x18);
            uVar14 = uVar14 >> 3;
            lVar8 = (long)msp + uVar14 * 0x10 + 0x38;
            if ((uVar17 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)uVar14 & 0x1f) | uVar17;
              lVar27 = lVar8;
            }
            else {
              lVar27 = *(long *)((long)msp + uVar14 * 0x10 + 0x48);
            }
            *(long *)((long)msp + uVar14 * 0x10 + 0x48) = lVar28;
            *(long *)(lVar27 + 0x18) = lVar28;
            *(long *)(lVar28 + 0x10) = lVar27;
            *(long *)(lVar28 + 0x18) = lVar8;
          }
          *(ulong *)((long)msp + 8) = uVar22;
          *(ulong *)((long)msp + 0x18) = lVar16 + uVar13;
        }
        goto LAB_00128a43;
      }
    }
  }
  else if (nsize < 0xffffffffffffff80) {
    uVar13 = nsize + 0xf & 0xfffffffffffffff8;
    uVar17 = *(uint *)((long)msp + 4);
    if (uVar17 != 0) {
      uVar21 = (uint)(nsize + 0xf >> 8);
      if (uVar21 == 0) {
        uVar14 = 0;
      }
      else if (uVar21 < 0x10000) {
        uVar24 = 0x1f;
        if (uVar21 != 0) {
          for (; uVar21 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar14 = (ulong)((uVar13 >> ((ulong)(byte)(0x26 - (char)(uVar24 ^ 0x1f)) & 0x3f) & 1) != 0)
                 | (ulong)((uVar24 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar14 = 0x1f;
      }
      uVar22 = -uVar13;
      lVar28 = *(long *)((long)msp + uVar14 * 8 + 0x248);
      if (lVar28 == 0) {
        lVar8 = 0;
        lVar16 = 0;
      }
      else {
        bVar23 = 0x39 - (char)(uVar14 >> 1);
        if (uVar14 == 0x1f) {
          bVar23 = 0;
        }
        lVar27 = uVar13 << (bVar23 & 0x3f);
        lVar8 = 0;
        lVar9 = 0;
        do {
          lVar16 = lVar28;
          uVar25 = (*(ulong *)(lVar16 + 8) & 0xfffffffffffffffc) - uVar13;
          if ((uVar25 < uVar22) && (lVar9 = lVar16, uVar22 = uVar25, uVar25 == 0)) {
            uVar22 = 0;
            lVar8 = lVar16;
            goto LAB_001290de;
          }
          lVar3 = *(long *)(lVar16 + 0x28);
          lVar28 = *(long *)(lVar16 + 0x20 + (lVar27 >> 0x3f) * -8);
          lVar16 = lVar3;
          if (lVar3 == lVar28) {
            lVar16 = lVar8;
          }
          if (lVar3 != 0) {
            lVar8 = lVar16;
          }
          lVar27 = lVar27 * 2;
          lVar16 = lVar9;
        } while (lVar28 != 0);
      }
      if (lVar8 != 0 || lVar16 != 0) goto LAB_001290de;
      uVar21 = 2 << ((byte)uVar14 & 0x1f);
      uVar21 = (-uVar21 | uVar21) & uVar17;
      if (uVar21 == 0) {
        lVar16 = 0;
        lVar8 = 0;
        goto LAB_001290de;
      }
      uVar24 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      plVar20 = (long *)((long)msp + (ulong)uVar24 * 8 + 0x248);
      lVar16 = 0;
LAB_001290db:
      lVar8 = *plVar20;
LAB_001290de:
      while (lVar28 = lVar8, lVar28 != 0) {
        uVar14 = (*(ulong *)(lVar28 + 8) & 0xfffffffffffffffc) - uVar13;
        bVar29 = uVar14 < uVar22;
        if (bVar29) {
          uVar22 = uVar14;
        }
        if (bVar29) {
          lVar16 = lVar28;
        }
        lVar8 = *(long *)(lVar28 + 0x20);
        if (*(long *)(lVar28 + 0x20) == 0) goto code_r0x00129105;
      }
      if ((lVar16 == 0) || (*(long *)((long)msp + 8) - uVar13 <= uVar22)) goto LAB_00128956;
      lVar28 = *(long *)(lVar16 + 0x18);
      lVar8 = *(long *)(lVar16 + 0x30);
      if (lVar28 != lVar16) {
        lVar27 = *(long *)(lVar16 + 0x10);
        *(long *)(lVar27 + 0x18) = lVar28;
        *(long *)(lVar28 + 0x10) = lVar27;
        goto LAB_00129183;
      }
      if (*(long *)(lVar16 + 0x28) != 0) {
        lVar27 = *(long *)(lVar16 + 0x28);
        puVar19 = (undefined8 *)(lVar16 + 0x28);
        goto LAB_0012915f;
      }
      if (*(long *)(lVar16 + 0x20) == 0) {
        lVar28 = 0;
      }
      else {
        lVar27 = *(long *)(lVar16 + 0x20);
        puVar19 = (undefined8 *)(lVar16 + 0x20);
LAB_0012915f:
        do {
          do {
            puVar26 = puVar19;
            lVar28 = lVar27;
            lVar27 = *(long *)(lVar28 + 0x28);
            puVar19 = (undefined8 *)(lVar28 + 0x28);
          } while (*(long *)(lVar28 + 0x28) != 0);
          lVar27 = *(long *)(lVar28 + 0x20);
          puVar19 = (undefined8 *)(lVar28 + 0x20);
        } while (*(long *)(lVar28 + 0x20) != 0);
        *puVar26 = 0;
      }
LAB_00129183:
      if (lVar8 != 0) {
        lVar27 = *(long *)(lVar16 + 0x38);
        if (lVar16 == *(long *)((long)msp + lVar27 * 8 + 0x248)) {
          *(long *)((long)msp + lVar27 * 8 + 0x248) = lVar28;
          if (lVar28 != 0) goto LAB_001291b2;
          *(uint *)((long)msp + 4) = uVar17 & ~(1 << ((uint)lVar27 & 0x1f));
        }
        else {
          *(long *)(lVar8 + 0x20 + (ulong)(*(long *)(lVar8 + 0x20) != lVar16) * 8) = lVar28;
          if (lVar28 != 0) {
LAB_001291b2:
            *(long *)(lVar28 + 0x30) = lVar8;
            lVar8 = *(long *)(lVar16 + 0x20);
            if (lVar8 != 0) {
              *(long *)(lVar28 + 0x20) = lVar8;
              *(long *)(lVar8 + 0x30) = lVar28;
            }
            lVar8 = *(long *)(lVar16 + 0x28);
            if (lVar8 != 0) {
              *(long *)(lVar28 + 0x28) = lVar8;
              *(long *)(lVar8 + 0x30) = lVar28;
            }
          }
        }
      }
      if (uVar22 < 0x20) {
        *(ulong *)(lVar16 + 8) = uVar22 + uVar13 | 3;
        pbVar2 = (byte *)(lVar16 + 8 + uVar22 + uVar13);
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        lVar28 = lVar16 + uVar13;
        *(ulong *)(lVar16 + 8) = uVar13 | 3;
        *(ulong *)(lVar16 + 8 + uVar13) = uVar22 | 1;
        *(ulong *)(lVar28 + uVar22) = uVar22;
        if (uVar22 < 0x100) {
          uVar22 = uVar22 >> 3;
          lVar8 = (long)msp + uVar22 * 0x10 + 0x38;
          if ((*msp >> ((uint)uVar22 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << ((byte)uVar22 & 0x1f);
            lVar27 = lVar8;
          }
          else {
            lVar27 = *(long *)((long)msp + uVar22 * 0x10 + 0x48);
          }
          *(long *)((long)msp + uVar22 * 0x10 + 0x48) = lVar28;
          *(long *)(lVar27 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar27;
          *(long *)(lVar28 + 0x18) = lVar8;
        }
        else {
          uVar17 = (uint)(uVar22 >> 8);
          if (uVar17 == 0) {
            uVar13 = 0;
          }
          else if (uVar17 < 0x10000) {
            uVar21 = 0x1f;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar21 == 0; uVar21 = uVar21 - 1) {
              }
            }
            uVar13 = (ulong)((uint)((uVar22 >> ((ulong)(byte)(0x26 - (char)(uVar21 ^ 0x1f)) & 0x3f)
                                    & 1) != 0) | (uVar21 ^ 0x1f) * 2 ^ 0x3e);
          }
          else {
            uVar13 = 0x1f;
          }
          plVar20 = (long *)((long)msp + uVar13 * 8 + 0x248);
          *(ulong *)(lVar28 + 0x38) = uVar13;
          *(undefined1 (*) [16])(lVar28 + 0x20) = (undefined1  [16])0x0;
          if ((*(uint *)((long)msp + 4) >> ((uint)uVar13 & 0x1f) & 1) == 0) {
            *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar13 & 0x1f);
            *plVar20 = lVar28;
            *(long **)(lVar28 + 0x30) = plVar20;
          }
          else {
            bVar23 = 0x39 - (char)(uVar13 >> 1);
            if (uVar13 == 0x1f) {
              bVar23 = 0;
            }
            lVar27 = uVar22 << (bVar23 & 0x3f);
            lVar8 = *plVar20;
            do {
              lVar9 = lVar8;
              if ((*(ulong *)(lVar9 + 8) & 0xfffffffffffffffc) == uVar22) {
                lVar8 = *(long *)(lVar9 + 0x10);
                *(long *)(lVar8 + 0x18) = lVar28;
                *(long *)(lVar9 + 0x10) = lVar28;
                *(long *)(lVar28 + 0x10) = lVar8;
                *(long *)(lVar28 + 0x18) = lVar9;
                *(undefined8 *)(lVar28 + 0x30) = 0;
                goto LAB_00128a43;
              }
              lVar3 = lVar27 >> 0x3f;
              lVar27 = lVar27 * 2;
              lVar8 = *(long *)(lVar9 + 0x20 + lVar3 * -8);
            } while (lVar8 != 0);
            *(long *)(lVar9 + 0x20 + lVar3 * -8) = lVar28;
            *(long *)(lVar28 + 0x30) = lVar9;
          }
          *(long *)(lVar28 + 0x18) = lVar28;
          *(long *)(lVar28 + 0x10) = lVar28;
        }
      }
      goto LAB_00128a43;
    }
  }
  else {
    uVar13 = 0xffffffffffffffff;
  }
LAB_00128956:
  uVar14 = *(ulong *)((long)msp + 8);
  uVar22 = uVar14 - uVar13;
  if (uVar13 <= uVar14) {
    lVar16 = *(long *)((long)msp + 0x18);
    if (uVar22 < 0x20) {
      *(ulong *)(lVar16 + 8) = uVar14 | 3;
      pbVar2 = (byte *)(lVar16 + 8 + uVar14);
      *pbVar2 = *pbVar2 | 1;
      lVar28 = 0;
      uVar22 = 0;
    }
    else {
      lVar28 = lVar16 + uVar13;
      *(ulong *)(lVar16 + 8 + uVar13) = uVar22 | 1;
      *(ulong *)(lVar16 + uVar14) = uVar22;
      *(ulong *)(lVar16 + 8) = uVar13 | 3;
    }
    *(long *)((long)msp + 0x18) = lVar28;
    *(ulong *)((long)msp + 8) = uVar22;
    goto LAB_00128a43;
  }
  uVar14 = *(ulong *)((long)msp + 0x10) - uVar13;
  if (*(ulong *)((long)msp + 0x10) < uVar13 || uVar14 == 0) {
    if (((0x1ffff < uVar13) && (uVar14 = uVar13 + 0x1036 & 0xfffffffffffff000, uVar13 < uVar14)) &&
       (pvVar10 = mmap_map32(uVar14), pvVar10 != (void *)0xffffffffffffffff)) {
      uVar13 = (ulong)(-(int)pvVar10 - 0x10U & 7);
      *(ulong *)((long)pvVar10 + uVar13) = uVar13 | 1;
      *(ulong *)((long)pvVar10 + uVar13 + 8) = (uVar14 - uVar13) - 0x20 | 2;
      *(undefined8 *)((long)pvVar10 + (uVar14 - uVar13) + -0x18 + uVar13) = 0xb;
      *(undefined8 *)((long)pvVar10 + (uVar14 - 0x10)) = 0;
      return (void *)((long)pvVar10 + uVar13 + 0x10);
    }
    uVar14 = uVar13 + 0x20040 & 0xfffffffffffe0000;
    if (uVar14 <= uVar13) {
      return (void *)0x0;
    }
    pvVar10 = mmap_map32(uVar14);
    if (pvVar10 == (void *)0xffffffffffffffff) {
      return (void *)0x0;
    }
    puVar1 = (ulong *)((long)msp + 0x348);
    for (puVar11 = puVar1; puVar11 != (ulong *)0x0; puVar11 = (ulong *)puVar11[2]) {
      if (pvVar10 == (void *)((long)*puVar11 + puVar11[1])) {
        pvVar4 = *(void **)((long)msp + 0x20);
        if (((void *)*puVar11 <= pvVar4) && (pvVar4 < pvVar10)) {
          puVar11[1] = puVar11[1] + uVar14;
          lVar28 = uVar14 + *(long *)((long)msp + 0x10);
          uVar22 = (ulong)(-(int)pvVar4 - 0x10U & 7);
          uVar14 = lVar28 - uVar22;
          *(ulong *)((long)msp + 0x20) = (long)pvVar4 + uVar22;
          *(ulong *)((long)msp + 0x10) = uVar14;
          *(ulong *)((long)pvVar4 + uVar22 + 8) = uVar14 | 1;
          *(undefined8 *)((long)pvVar4 + lVar28 + 8) = 0x40;
          *(undefined8 *)((long)msp + 0x28) = 0x200000;
          goto LAB_00128e25;
        }
        break;
      }
    }
    puVar11 = puVar1;
    while( true ) {
      if (puVar11 == (ulong *)0x0) goto LAB_00128ac3;
      uVar22 = *puVar11;
      if (uVar22 == (long)pvVar10 + uVar14) break;
      puVar11 = (ulong *)puVar11[2];
    }
    *puVar11 = (ulong)pvVar10;
    puVar11[1] = puVar11[1] + uVar14;
    uVar25 = (ulong)(-(int)pvVar10 - 0x10U & 7);
    lVar16 = (-(int)uVar22 - 0x10U & 7) + uVar22;
    lVar28 = (long)pvVar10 + uVar13 + uVar25;
    uVar14 = lVar16 - lVar28;
    *(ulong *)((long)pvVar10 + uVar25 + 8) = uVar13 | 3;
    if (lVar16 == *(long *)((long)msp + 0x20)) {
      uVar14 = uVar14 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar14;
      *(long *)((long)msp + 0x20) = lVar28;
      *(ulong *)(lVar28 + 8) = uVar14 | 1;
      goto LAB_0012905d;
    }
    if (lVar16 == *(long *)((long)msp + 0x18)) {
      uVar14 = uVar14 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar14;
      *(long *)((long)msp + 0x18) = lVar28;
      *(ulong *)(lVar28 + 8) = uVar14 | 1;
      *(ulong *)(lVar28 + uVar14) = uVar14;
      goto LAB_0012905d;
    }
    uVar13 = *(ulong *)(lVar16 + 8);
    if ((uVar13 & 2) != 0) goto LAB_00128f14;
    uVar22 = uVar13 & 0xfffffffffffffffc;
    lVar8 = *(long *)(lVar16 + 0x18);
    if (uVar13 < 0x100) {
      lVar27 = *(long *)(lVar16 + 0x10);
      if (lVar27 == lVar8) {
        bVar23 = (byte)(uVar13 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
      }
      else {
        *(long *)(lVar27 + 0x18) = lVar8;
        *(long *)(lVar8 + 0x10) = lVar27;
      }
      goto LAB_00128f09;
    }
    lVar27 = *(long *)(lVar16 + 0x30);
    if (lVar8 != lVar16) {
      lVar9 = *(long *)(lVar16 + 0x10);
      *(long *)(lVar9 + 0x18) = lVar8;
      *(long *)(lVar8 + 0x10) = lVar9;
      goto LAB_00128ea4;
    }
    if (*(long *)(lVar16 + 0x28) != 0) {
      lVar9 = *(long *)(lVar16 + 0x28);
      puVar19 = (undefined8 *)(lVar16 + 0x28);
      goto LAB_00128e80;
    }
    if (*(long *)(lVar16 + 0x20) == 0) {
      lVar8 = 0;
    }
    else {
      lVar9 = *(long *)(lVar16 + 0x20);
      puVar19 = (undefined8 *)(lVar16 + 0x20);
LAB_00128e80:
      do {
        do {
          puVar26 = puVar19;
          lVar8 = lVar9;
          lVar9 = *(long *)(lVar8 + 0x28);
          puVar19 = (undefined8 *)(lVar8 + 0x28);
        } while (*(long *)(lVar8 + 0x28) != 0);
        lVar9 = *(long *)(lVar8 + 0x20);
        puVar19 = (undefined8 *)(lVar8 + 0x20);
      } while (*(long *)(lVar8 + 0x20) != 0);
      *puVar26 = 0;
    }
LAB_00128ea4:
    if (lVar27 != 0) {
      lVar9 = *(long *)(lVar16 + 0x38);
      if (lVar16 == *(long *)((long)msp + lVar9 * 8 + 0x248)) {
        *(long *)((long)msp + lVar9 * 8 + 0x248) = lVar8;
        if (lVar8 == 0) {
          bVar23 = (byte)lVar9 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar23 | 0xfffffffeU >> 0x20 - bVar23);
          goto LAB_00128f09;
        }
      }
      else {
        *(long *)(lVar27 + 0x20 + (ulong)(*(long *)(lVar27 + 0x20) != lVar16) * 8) = lVar8;
        if (lVar8 == 0) goto LAB_00128f09;
      }
      *(long *)(lVar8 + 0x30) = lVar27;
      lVar27 = *(long *)(lVar16 + 0x20);
      if (lVar27 != 0) {
        *(long *)(lVar8 + 0x20) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar8;
      }
      lVar27 = *(long *)(lVar16 + 0x28);
      if (lVar27 != 0) {
        *(long *)(lVar8 + 0x28) = lVar27;
        *(long *)(lVar27 + 0x30) = lVar8;
      }
    }
LAB_00128f09:
    uVar13 = *(ulong *)(lVar16 + 8 + uVar22);
    lVar16 = lVar16 + uVar22;
    uVar14 = uVar14 + uVar22;
LAB_00128f14:
    *(ulong *)(lVar16 + 8) = uVar13 & 0xfffffffffffffffe;
    *(ulong *)(lVar28 + 8) = uVar14 | 1;
    *(ulong *)(lVar28 + uVar14) = uVar14;
    if (uVar14 < 0x100) {
      uVar14 = uVar14 >> 3;
      lVar16 = (long)msp + uVar14 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar14 & 0x1f);
        lVar8 = lVar16;
      }
      else {
        lVar8 = *(long *)((long)msp + uVar14 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar14 * 0x10 + 0x48) = lVar28;
      *(long *)(lVar8 + 0x18) = lVar28;
      *(long *)(lVar28 + 0x10) = lVar8;
      *(long *)(lVar28 + 0x18) = lVar16;
    }
    else {
      uVar17 = (uint)(uVar14 >> 8);
      if (uVar17 == 0) {
        uVar13 = 0;
      }
      else if (uVar17 < 0x10000) {
        uVar21 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar13 = (ulong)((uint)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar21 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar21 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar13 = 0x1f;
      }
      plVar20 = (long *)((long)msp + uVar13 * 8 + 0x248);
      *(ulong *)(lVar28 + 0x38) = uVar13;
      *(undefined1 (*) [16])(lVar28 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar13 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar13 & 0x1f);
        *plVar20 = lVar28;
        *(long **)(lVar28 + 0x30) = plVar20;
      }
      else {
        bVar23 = 0x39 - (char)(uVar13 >> 1);
        if (uVar13 == 0x1f) {
          bVar23 = 0;
        }
        lVar8 = uVar14 << (bVar23 & 0x3f);
        lVar16 = *plVar20;
        do {
          lVar27 = lVar16;
          if ((*(ulong *)(lVar27 + 8) & 0xfffffffffffffffc) == uVar14) {
            lVar16 = *(long *)(lVar27 + 0x10);
            *(long *)(lVar16 + 0x18) = lVar28;
            *(long *)(lVar27 + 0x10) = lVar28;
            *(long *)(lVar28 + 0x10) = lVar16;
            *(long *)(lVar28 + 0x18) = lVar27;
            *(undefined8 *)(lVar28 + 0x30) = 0;
            goto LAB_0012905d;
          }
          lVar9 = lVar8 >> 0x3f;
          lVar8 = lVar8 * 2;
          lVar16 = *(long *)(lVar27 + 0x20 + lVar9 * -8);
        } while (lVar16 != 0);
        *(long *)(lVar27 + 0x20 + lVar9 * -8) = lVar28;
        *(long *)(lVar28 + 0x30) = lVar27;
      }
      *(long *)(lVar28 + 0x18) = lVar28;
      *(long *)(lVar28 + 0x10) = lVar28;
    }
LAB_0012905d:
    return (void *)((long)pvVar10 + uVar25 + 0x10);
  }
  goto LAB_0012896b;
code_r0x00129105:
  plVar20 = (long *)(lVar28 + 0x28);
  goto LAB_001290db;
LAB_00128ac3:
  addr = *(undefined1 (**) [16])((long)msp + 0x20);
  pmVar12 = segment_holding((mstate)msp,(char *)addr);
  pauVar18 = (undefined1 (*) [16])(pmVar12->base + pmVar12->size);
  pauVar15 = (undefined1 (*) [16])(pauVar18[-5] + (ulong)(0x37U - (int)pauVar18 & 7) + 9);
  if ((undefined1 (*) [16])(pauVar18[-5] + (ulong)(0x37U - (int)pauVar18 & 7) + 9) < addr + 2) {
    pauVar15 = addr;
  }
  uVar22 = (ulong)(-(int)pvVar10 - 0x10U & 7);
  uVar25 = (uVar14 - 0x40) - uVar22;
  *(ulong *)((long)msp + 0x20) = (long)pvVar10 + uVar22;
  *(ulong *)((long)msp + 0x10) = uVar25;
  *(ulong *)((long)pvVar10 + uVar22 + 8) = uVar25 | 1;
  *(undefined8 *)((long)pvVar10 + (uVar14 - 0x38)) = 0x40;
  *(undefined8 *)((long)msp + 0x28) = 0x200000;
  *(undefined8 *)(*pauVar15 + 8) = 0x23;
  uVar5 = *(undefined8 *)((long)msp + 0x350);
  *(ulong *)pauVar15[1] = *puVar1;
  *(undefined8 *)(pauVar15[1] + 8) = uVar5;
  *(undefined8 *)pauVar15[2] = *(undefined8 *)((long)msp + 0x358);
  *(void **)((long)msp + 0x348) = pvVar10;
  *(ulong *)((long)msp + 0x350) = uVar14;
  *(undefined1 (**) [16])((long)msp + 0x358) = pauVar15 + 1;
  auVar7 = _DAT_00159220;
  auVar6 = _DAT_00159210;
  if (pauVar18 <= pauVar15 + 3) {
    pauVar18 = pauVar15 + 3;
  }
  uVar22 = (long)pauVar18 + (-0x29 - (long)pauVar15);
  auVar32._8_4_ = (int)uVar22;
  auVar32._0_8_ = uVar22;
  auVar32._12_4_ = (int)(uVar22 >> 0x20);
  auVar30._0_8_ = uVar22 >> 3;
  auVar30._8_8_ = auVar32._8_8_ >> 3;
  uVar14 = 0;
  auVar30 = auVar30 ^ _DAT_00159220;
  do {
    auVar31._8_4_ = (int)uVar14;
    auVar31._0_8_ = uVar14;
    auVar31._12_4_ = (int)(uVar14 >> 0x20);
    auVar32 = (auVar31 | auVar6) ^ auVar7;
    if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                auVar30._4_4_ < auVar32._4_4_) & 1)) {
      *(undefined8 *)(pauVar15[2] + uVar14 * 8 + 8) = 0xb;
    }
    if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
        auVar32._12_4_ <= auVar30._12_4_) {
      *(undefined8 *)(pauVar15[3] + uVar14 * 8) = 0xb;
    }
    uVar14 = uVar14 + 2;
  } while (((uVar22 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
  uVar14 = (long)pauVar15 - (long)addr;
  if (uVar14 != 0) {
    (*pauVar15)[8] = (*pauVar15)[8] & 0xfe;
    *(ulong *)(*addr + 8) = uVar14 | 1;
    *(ulong *)*pauVar15 = uVar14;
    if (uVar14 < 0x100) {
      uVar14 = uVar14 >> 3;
      pauVar15 = (undefined1 (*) [16])((long)msp + uVar14 * 0x10 + 0x38);
      if ((*msp >> ((uint)uVar14 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar14 & 0x1f);
        pauVar18 = pauVar15;
      }
      else {
        pauVar18 = *(undefined1 (**) [16])((long)msp + uVar14 * 0x10 + 0x48);
      }
      *(undefined1 (**) [16])((long)msp + uVar14 * 0x10 + 0x48) = addr;
      *(undefined1 (**) [16])(pauVar18[1] + 8) = addr;
      lVar28 = 0x18;
      lVar16 = 0x10;
    }
    else {
      uVar17 = (uint)(uVar14 >> 8);
      if (uVar17 == 0) {
        uVar22 = 0;
      }
      else if (uVar17 < 0x10000) {
        uVar21 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar21 == 0; uVar21 = uVar21 - 1) {
          }
        }
        uVar22 = (ulong)((uint)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar21 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar21 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar22 = 0x1f;
      }
      puVar19 = (undefined8 *)((long)msp + uVar22 * 8 + 0x248);
      *(ulong *)(addr[3] + 8) = uVar22;
      addr[2] = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar22 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar22 & 0x1f);
        *puVar19 = addr;
        *(undefined8 **)addr[3] = puVar19;
      }
      else {
        bVar23 = 0x39 - (char)(uVar22 >> 1);
        if (uVar22 == 0x1f) {
          bVar23 = 0;
        }
        lVar28 = uVar14 << (bVar23 & 0x3f);
        pauVar15 = (undefined1 (*) [16])*puVar19;
        do {
          pauVar18 = pauVar15;
          if ((*(ulong *)(*pauVar18 + 8) & 0xfffffffffffffffc) == uVar14) {
            lVar28 = *(long *)pauVar18[1];
            *(undefined1 (**) [16])(lVar28 + 0x18) = addr;
            *(undefined1 (**) [16])pauVar18[1] = addr;
            *(long *)addr[1] = lVar28;
            lVar28 = 0x30;
            lVar16 = 0x18;
            pauVar15 = (undefined1 (*) [16])0x0;
            goto LAB_00128e1d;
          }
          lVar16 = lVar28 >> 0x3f;
          lVar28 = lVar28 * 2;
          pauVar15 = *(undefined1 (**) [16])((long)pauVar18 + lVar16 * -8 + 0x20);
        } while (pauVar15 != (undefined1 (*) [16])0x0);
        *(undefined1 (**) [16])((long)pauVar18 + lVar16 * -8 + 0x20) = addr;
        *(undefined1 (**) [16])addr[3] = pauVar18;
      }
      lVar28 = 0x10;
      lVar16 = 0x18;
      pauVar18 = addr;
      pauVar15 = addr;
    }
LAB_00128e1d:
    *(undefined1 (**) [16])(*addr + lVar16) = pauVar18;
    *(undefined1 (**) [16])(*addr + lVar28) = pauVar15;
  }
LAB_00128e25:
  uVar14 = *(ulong *)((long)msp + 0x10) - uVar13;
  if (*(ulong *)((long)msp + 0x10) < uVar13 || uVar14 == 0) {
    return (void *)0x0;
  }
LAB_0012896b:
  *(ulong *)((long)msp + 0x10) = uVar14;
  lVar16 = *(long *)((long)msp + 0x20);
  *(ulong *)((long)msp + 0x20) = lVar16 + uVar13;
  *(ulong *)(lVar16 + 8 + uVar13) = uVar14 | 1;
  *(ulong *)(lVar16 + 8) = uVar13 | 3;
LAB_00128a43:
  return (void *)(lVar16 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}